

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopMan.c
# Opt level: O0

void Hop_ManPrintStats(Hop_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  Hop_Man_t *p_local;
  
  uVar1 = Hop_ManPiNum(p);
  uVar2 = Hop_ManPoNum(p);
  printf("PI/PO = %d/%d. ",(ulong)uVar1,(ulong)uVar2);
  uVar1 = Hop_ManAndNum(p);
  printf("A = %7d. ",(ulong)uVar1);
  uVar1 = Hop_ManExorNum(p);
  printf("X = %5d. ",(ulong)uVar1);
  printf("Cre = %7d. ",(ulong)(uint)p->nCreated);
  printf("Del = %7d. ",(ulong)(uint)p->nDeleted);
  uVar1 = Hop_ManCountLevels(p);
  printf("Lev = %3d. ",(ulong)uVar1);
  printf("\n");
  return;
}

Assistant:

void Hop_ManPrintStats( Hop_Man_t * p )
{
    printf( "PI/PO = %d/%d. ", Hop_ManPiNum(p), Hop_ManPoNum(p) );
    printf( "A = %7d. ",       Hop_ManAndNum(p) );
    printf( "X = %5d. ",       Hop_ManExorNum(p) );
    printf( "Cre = %7d. ",     p->nCreated );
    printf( "Del = %7d. ",     p->nDeleted );
    printf( "Lev = %3d. ",     Hop_ManCountLevels(p) );
    printf( "\n" );
}